

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_line.cpp
# Opt level: O0

double __thiscall ON_Line::MinimumDistanceTo(ON_Line *this,ON_3dPoint *P)

{
  bool bVar1;
  double dVar2;
  ON_3dPoint local_40;
  double local_28;
  double t;
  double d;
  ON_3dPoint *P_local;
  ON_Line *this_local;
  
  d = (double)P;
  P_local = &this->from;
  bVar1 = ClosestPointTo(this,P,&local_28);
  if (bVar1) {
    if (0.0 <= local_28) {
      if (1.0 < local_28) {
        local_28 = 1.0;
      }
    }
    else {
      local_28 = 0.0;
    }
    PointAt(&local_40,this,local_28);
    t = ON_3dPoint::DistanceTo(&local_40,(ON_3dPoint *)d);
  }
  else {
    t = ON_3dPoint::DistanceTo(&this->from,(ON_3dPoint *)d);
    dVar2 = ON_3dPoint::DistanceTo(&this->to,(ON_3dPoint *)d);
    if (dVar2 < t) {
      t = dVar2;
    }
  }
  return t;
}

Assistant:

double ON_Line::MinimumDistanceTo( const ON_3dPoint& P ) const
{
  double d, t;
  if (ClosestPointTo(P,&t))
  {
    if ( t < 0.0 ) t = 0.0; else if (t > 1.0) t = 1.0;
    d = PointAt(t).DistanceTo(P);
  }
  else
  {
    // degenerate line
    d = from.DistanceTo(P);
    t = to.DistanceTo(P);
    if ( t < d )
      d = t;
  }
  return d;
}